

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_color_blend_state
          (Impl *this,Value *blend,VkPipelineColorBlendStateCreateInfo **out_info)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  Number in_RAX;
  VkPipelineColorBlendStateCreateInfo *pVVar4;
  Type pGVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Number NVar6;
  uint i;
  long lVar7;
  undefined8 local_38;
  
  local_38 = in_RAX;
  pVVar4 = (VkPipelineColorBlendStateCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x38,0x10);
  if (pVVar4 != (VkPipelineColorBlendStateCreateInfo *)0x0) {
    *(undefined8 *)((long)&pVVar4->pAttachments + 4) = 0;
    pVVar4->blendConstants[1] = 0.0;
    pVVar4->blendConstants[2] = 0.0;
    pVVar4->logicOpEnable = 0;
    pVVar4->logicOp = VK_LOGIC_OP_CLEAR;
    *(undefined8 *)&pVVar4->attachmentCount = 0;
    *(undefined8 *)&pVVar4->field_0x4 = 0;
    *(undefined8 *)((long)&pVVar4->pNext + 4) = 0;
    pVVar4->blendConstants[3] = 0.0;
  }
  pVVar4->sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)blend,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar4->flags = (pGVar5->data_).s.length;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)blend,"logicOp");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar4->logicOp = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)blend,"logicOpEnable");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar4->logicOpEnable = (pGVar5->data_).s.length;
        lVar7 = 0;
        do {
          pGVar5 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)blend,"blendConstants");
          this_00 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::operator[](pGVar5,(SizeType)lVar7);
          dVar1 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetDouble(this_00);
          pVVar4->blendConstants[lVar7] = (float)dVar1;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffc8,(Ch *)blend);
        uVar2 = local_38;
        NVar6.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(blend);
        if (uVar2 != NVar6.i64) {
          pGVar5 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)blend,"attachments");
          if ((pGVar5->data_).f.flags != 4) {
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          pVVar4->attachmentCount = (pGVar5->data_).s.length;
          pGVar5 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)blend,"attachments");
          parse_blend_attachments(this,pGVar5,&pVVar4->pAttachments);
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffc8,(Ch *)blend);
        NVar6.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(blend);
        if (local_38 != NVar6.i64) {
          pGVar5 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)blend,"pNext");
          bVar3 = parse_pnext_chain(this,pGVar5,&pVVar4->pNext,(StateCreatorInterface *)0x0,
                                    (DatabaseInterface *)0x0,(Value *)0x0);
          if (!bVar3) {
            return false;
          }
        }
        *out_info = pVVar4;
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_color_blend_state(const Value &blend, const VkPipelineColorBlendStateCreateInfo **out_info)
{
	auto *state = allocator.allocate_cleared<VkPipelineColorBlendStateCreateInfo>();
	state->sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
	state->flags = blend["flags"].GetUint();

	state->logicOp = static_cast<VkLogicOp>(blend["logicOp"].GetUint());
	state->logicOpEnable = blend["logicOpEnable"].GetUint();
	for (unsigned i = 0; i < 4; i++)
		state->blendConstants[i] = blend["blendConstants"][i].GetFloat();

	if (blend.HasMember("attachments"))
	{
		state->attachmentCount = blend["attachments"].Size();
		if (!parse_blend_attachments(blend["attachments"], &state->pAttachments))
			return false;
	}

	if (blend.HasMember("pNext"))
		if (!parse_pnext_chain(blend["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}